

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O3

string * fs_user_config_dir_abi_cxx11_(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  string *h;
  ulong in_RSI;
  string *in_RDI;
  string_view name;
  string_view name_00;
  string h_1;
  string local_38;
  
  name._M_str = "XDG_CONFIG_HOME";
  name._M_len = in_RSI;
  fs_getenv_abi_cxx11_(in_RDI,name);
  if (in_RDI->_M_string_length == 0) {
    pcVar2 = (in_RDI->_M_dataplus)._M_p;
    paVar1 = &in_RDI->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      in_RSI = paVar1->_M_allocated_capacity + 1;
      operator_delete(pcVar2,in_RSI);
    }
    name_00._M_str = "HOME";
    name_00._M_len = in_RSI;
    fs_getenv_abi_cxx11_(&local_38,name_00);
    if (local_38._M_string_length != 0) {
      (in_RDI->_M_dataplus)._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (in_RDI,"/.config");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if (local_38._M_string_length == 0) {
      fs_print_error("","fs_user_config_dir");
      (in_RDI->_M_dataplus)._M_p = (pointer)paVar1;
      in_RDI->_M_string_length = 0;
      (in_RDI->field_2)._M_local_buf[0] = '\0';
    }
  }
  return in_RDI;
}

Assistant:

std::string fs_user_config_dir()
{
#if defined(_WIN32)
  PWSTR s = nullptr;
  std::string r;
  if(SHGetKnownFolderPath(FOLDERID_LocalAppData, 0, nullptr, &s) == S_OK)  FFS_LIKELY
    r = fs_as_posix(fs_win32_to_narrow(s));

  CoTaskMemFree(s);
  // https://learn.microsoft.com/en-us/windows/win32/api/combaseapi/nf-combaseapi-cotaskmemfree

  if (!r.empty())  FFS_LIKELY
    return r;
#else
  if(std::string h = fs_getenv("XDG_CONFIG_HOME"); !h.empty())
    return h;
  if(std::string h = fs_getenv("HOME"); !h.empty())
    return h + "/.config";
#endif

  fs_print_error("", __func__);
  return {};
}